

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

Promise<void> __thiscall
kj::
newAdaptedPromise<void,kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend,kj::(anonymous_namespace)::WebSocketPipeImpl&,kj::OneOf<kj::ArrayPtr<char_const>,kj::ArrayPtr<unsigned_char_const>,kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>>
          (kj *this,WebSocketPipeImpl *adapterConstructorParams,
          OneOf<kj::ArrayPtr<const_char>,_kj::ArrayPtr<const_unsigned_char>,_kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
          *adapterConstructorParams_1)

{
  undefined8 *puVar1;
  PromiseNode *extraout_RDX;
  Promise<void> PVar2;
  Fault local_78;
  Own<kj::_::AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend>_>
  local_70;
  Own<kj::_::PromiseNode> local_60;
  OneOf<kj::ArrayPtr<const_char>,_kj::ArrayPtr<const_unsigned_char>,_kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
  local_50;
  
  puVar1 = (undefined8 *)operator_new(0x1c8);
  puVar1[1] = 0;
  *puVar1 = &PTR_onReady_00428f40;
  puVar1[2] = &PTR_fulfill_00428f88;
  *(undefined1 *)(puVar1 + 3) = 0;
  *(undefined1 *)(puVar1 + 0x2f) = 0;
  *(undefined1 *)(puVar1 + 0x30) = 1;
  OneOf<kj::ArrayPtr<const_char>,_kj::ArrayPtr<const_unsigned_char>,_kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
  ::OneOf(&local_50,adapterConstructorParams_1);
  puVar1[0x31] = &PTR_send_00428fe8;
  puVar1[0x32] = puVar1 + 2;
  puVar1[0x33] = adapterConstructorParams;
  OneOf<kj::ArrayPtr<const_char>,_kj::ArrayPtr<const_unsigned_char>,_kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
  ::OneOf((OneOf<kj::ArrayPtr<const_char>,_kj::ArrayPtr<const_unsigned_char>,_kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
           *)(puVar1 + 0x34),&local_50);
  puVar1[0x38] = 0;
  if ((adapterConstructorParams->state).ptr == (WebSocket *)0x0) {
    (adapterConstructorParams->state).ptr = (WebSocket *)(puVar1 + 0x31);
    local_70.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::AdapterPromiseNode<kj::_::Void,kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend>>
          ::instance;
    local_60.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::AdapterPromiseNode<kj::_::Void,kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend>>
          ::instance;
    local_70.ptr = (AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend>
                    *)0x0;
    *(undefined8 **)this =
         &_::
          HeapDisposer<kj::_::AdapterPromiseNode<kj::_::Void,kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend>>
          ::instance;
    *(undefined8 **)(this + 8) = puVar1;
    local_60.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_60);
    Own<kj::_::AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend>_>
    ::~Own(&local_70);
    PVar2.super_PromiseBase.node.ptr = extraout_RDX;
    PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
    return (Promise<void>)PVar2.super_PromiseBase.node;
  }
  _::Debug::Fault::Fault
            (&local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
             ,0xa80,FAILED,"pipe.state == nullptr","");
  _::Debug::Fault::fatal(&local_78);
}

Assistant:

Promise<T> newAdaptedPromise(Params&&... adapterConstructorParams) {
  return Promise<T>(false, heap<_::AdapterPromiseNode<_::FixVoid<T>, Adapter>>(
      kj::fwd<Params>(adapterConstructorParams)...));
}